

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O0

int If_CutSopBalanceEval(If_Man_t *p,If_Cut_t *pCut,Vec_Int_t *vAig)

{
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar1;
  Vec_Int_t *vAig_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  If_Obj_t *pIVar5;
  If_Cut_t *pIVar6;
  word *pwVar7;
  int local_1a8 [2];
  int pIsop [64];
  undefined1 local_a0 [8];
  Vec_Int_t vIsop;
  int Two;
  int Max;
  int pTimes [15];
  int local_44;
  uint local_40;
  int i;
  int Area;
  int Delay;
  Vec_Int_t *vCover;
  Vec_Int_t *pVStack_28;
  int fVerbose;
  Vec_Int_t *vAig_local;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xffffdfff | 0x2000;
  pVStack_28 = vAig;
  vAig_local = (Vec_Int_t *)pCut;
  pCut_local = (If_Cut_t *)p;
  if (vAig != (Vec_Int_t *)0x0) {
    Vec_IntClear(vAig);
  }
  if (*(uint *)((long)&vAig_local[1].pArray + 4) >> 0x18 == 0) {
    iVar2 = If_CutTruthLit((If_Cut_t *)vAig_local);
    iVar2 = Abc_Lit2Var(iVar2);
    pVVar1 = pVStack_28;
    if (iVar2 != 0) {
      __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                    ,0xff,"int If_CutSopBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
    }
    if (pVStack_28 != (Vec_Int_t *)0x0) {
      iVar2 = If_CutTruthLit((If_Cut_t *)vAig_local);
      iVar2 = Abc_LitIsCompl(iVar2);
      Vec_IntPush(pVVar1,iVar2);
    }
    *(uint *)((long)&vAig_local[1].pArray + 4) =
         *(uint *)((long)&vAig_local[1].pArray + 4) & 0xfffff000;
    p_local._4_4_ = 0;
  }
  else if (*(uint *)((long)&vAig_local[1].pArray + 4) >> 0x18 == 1) {
    iVar2 = If_CutTruthLit((If_Cut_t *)vAig_local);
    iVar2 = Abc_Lit2Var(iVar2);
    if (iVar2 != 1) {
      __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                    ,0x107,"int If_CutSopBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
    }
    if (pVStack_28 != (Vec_Int_t *)0x0) {
      Vec_IntPush(pVStack_28,0);
    }
    pVVar1 = pVStack_28;
    if (pVStack_28 != (Vec_Int_t *)0x0) {
      iVar2 = If_CutTruthLit((If_Cut_t *)vAig_local);
      iVar2 = Abc_LitIsCompl(iVar2);
      Vec_IntPush(pVVar1,iVar2);
    }
    *(uint *)((long)&vAig_local[1].pArray + 4) =
         *(uint *)((long)&vAig_local[1].pArray + 4) & 0xfffff000;
    pIVar5 = If_CutLeaf((If_Man_t *)pCut_local,(If_Cut_t *)vAig_local,0);
    pIVar6 = If_ObjCutBest(pIVar5);
    p_local._4_4_ = (int)pIVar6->Delay;
  }
  else {
    vCover._4_4_ = 0;
    p_00 = *(Vec_Wec_t **)
            (&pCut_local[0x25].Power +
            (ulong)(*(uint *)((long)&vAig_local[1].pArray + 4) >> 0x18) * 2);
    iVar2 = If_CutTruthLit((If_Cut_t *)vAig_local);
    iVar2 = Abc_Lit2Var(iVar2);
    _Area = Vec_WecEntry(p_00,iVar2);
    local_40 = 0;
    if (_Area == (Vec_Int_t *)0x0) {
      p_local._4_4_ = -1;
    }
    else {
      iVar2 = Vec_IntSize(_Area);
      if (iVar2 < 1) {
        __assert_fail("Vec_IntSize(vCover) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                      ,0x117,"int If_CutSopBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
      }
      for (local_44 = 0; iVar2 = If_CutLeaveNum((If_Cut_t *)vAig_local), pVVar1 = _Area,
          local_44 < iVar2; local_44 = local_44 + 1) {
        pIVar5 = If_CutLeaf((If_Man_t *)pCut_local,(If_Cut_t *)vAig_local,local_44);
        pIVar6 = If_ObjCutBest(pIVar5);
        (&Two)[local_44] = (int)pIVar6->Delay;
      }
      iVar2 = If_CutLeaveNum((If_Cut_t *)vAig_local);
      vAig_00 = pVStack_28;
      iVar3 = If_CutTruthLit((If_Cut_t *)vAig_local);
      uVar4 = Abc_LitIsCompl(iVar3);
      i = If_CutSopBalanceEvalIntInt
                    (pVVar1,iVar2,&Two,vAig_00,
                     uVar4 ^ *(uint *)((long)&vAig_local[1].pArray + 4) >> 0xc & 1,(int *)&local_40)
      ;
      *(uint *)((long)&vAig_local[1].pArray + 4) =
           *(uint *)((long)&vAig_local[1].pArray + 4) & 0xfffff000 | local_40 & 0xfff;
      if (vCover._4_4_ != 0) {
        vIsop.pArray._4_4_ = 0;
        vIsop.pArray._0_4_ = 0;
        for (local_44 = 0; iVar2 = If_CutLeaveNum((If_Cut_t *)vAig_local), local_44 < iVar2;
            local_44 = local_44 + 1) {
          vIsop.pArray._4_4_ = Abc_MaxInt(vIsop.pArray._4_4_,(&Two)[local_44]);
        }
        for (local_44 = 0; iVar2 = If_CutLeaveNum((If_Cut_t *)vAig_local), local_44 < iVar2;
            local_44 = local_44 + 1) {
          if ((&Two)[local_44] != vIsop.pArray._4_4_) {
            vIsop.pArray._0_4_ = Abc_MaxInt((int)vIsop.pArray,(&Two)[local_44]);
          }
        }
        if (((int)vIsop.pArray + 2 < vIsop.pArray._4_4_) && (vIsop.pArray._4_4_ + 3 < i)) {
          for (local_44 = 0; iVar2 = If_CutLeaveNum((If_Cut_t *)vAig_local), local_44 < iVar2;
              local_44 = local_44 + 1) {
            printf("%3d ",(ulong)(uint)(&Two)[local_44]);
          }
          for (; local_44 < **(int **)&pCut_local->Power; local_44 = local_44 + 1) {
            printf("    ");
          }
          printf("-> %3d   ",(ulong)(uint)i);
          pwVar7 = If_CutTruthW((If_Man_t *)pCut_local,(If_Cut_t *)vAig_local);
          iVar2 = If_CutLeaveNum((If_Cut_t *)vAig_local);
          Dau_DsdPrintFromTruth(pwVar7,iVar2);
          pVVar1 = _Area;
          iVar2 = If_CutLeaveNum((If_Cut_t *)vAig_local);
          iVar3 = If_CutTruthLit((If_Cut_t *)vAig_local);
          uVar4 = Abc_LitIsCompl(iVar3);
          Kit_TruthIsopPrintCover
                    (pVVar1,iVar2,uVar4 ^ *(uint *)((long)&vAig_local[1].pArray + 4) >> 0xc & 1);
          pwVar7 = If_CutTruthW((If_Man_t *)pCut_local,(If_Cut_t *)vAig_local);
          local_a0._0_4_ =
               Abc_Tt6Esop(*pwVar7,*(uint *)((long)&vAig_local[1].pArray + 4) >> 0x18,local_1a8);
          vIsop._0_8_ = local_1a8;
          local_a0._4_4_ = local_a0._0_4_;
          uVar4 = Vec_IntSize(_Area);
          printf("ESOP (%d -> %d)\n",(ulong)uVar4,(ulong)(uint)local_a0._4_4_);
          iVar2 = If_CutLeaveNum((If_Cut_t *)vAig_local);
          Kit_TruthIsopPrintCover((Vec_Int_t *)local_a0,iVar2,0);
          printf("\n");
        }
      }
      p_local._4_4_ = i;
    }
  }
  return p_local._4_4_;
}

Assistant:

int If_CutSopBalanceEval( If_Man_t * p, If_Cut_t * pCut, Vec_Int_t * vAig )
{
    pCut->fUser = 1;
    if ( vAig )
        Vec_IntClear( vAig );
    if ( pCut->nLeaves == 0 ) // const
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutTruthLit(pCut)) );
        pCut->Cost = 0;
        return 0;
    }
    if ( pCut->nLeaves == 1 ) // variable
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 1 );
        if ( vAig )
            Vec_IntPush( vAig, 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutTruthLit(pCut)) );
        pCut->Cost = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        int fVerbose = 0;
        Vec_Int_t * vCover = Vec_WecEntry( p->vTtIsops[pCut->nLeaves], Abc_Lit2Var(If_CutTruthLit(pCut)) );
        int Delay, Area = 0;
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        if ( vCover == NULL )
            return -1;
        assert( Vec_IntSize(vCover) > 0 );
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay; 
        Delay = If_CutSopBalanceEvalIntInt( vCover, If_CutLeaveNum(pCut), pTimes, vAig, Abc_LitIsCompl(If_CutTruthLit(pCut)) ^ pCut->fCompl, &Area );
        pCut->Cost = Area;
        if ( fVerbose )
        {
            int Max = 0, Two = 0;
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                Max = Abc_MaxInt( Max, pTimes[i] );
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                if ( pTimes[i] != Max )
                    Two = Abc_MaxInt( Two, pTimes[i] );
            if ( Two + 2 < Max && Max + 3 < Delay )
            {
                for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                    printf( "%3d ", pTimes[i] );
                for ( ; i < p->pPars->nLutSize; i++ )
                    printf( "    " );
                printf( "-> %3d   ", Delay );
                Dau_DsdPrintFromTruth( If_CutTruthW(p, pCut), If_CutLeaveNum(pCut) );
                Kit_TruthIsopPrintCover( vCover, If_CutLeaveNum(pCut), Abc_LitIsCompl(If_CutTruthLit(pCut)) ^ pCut->fCompl );
                {
                    Vec_Int_t vIsop;
                    int pIsop[64];
                    vIsop.nCap = vIsop.nSize = Abc_Tt6Esop( *If_CutTruthW(p, pCut), pCut->nLeaves, pIsop );
                    vIsop.pArray = pIsop;
                    printf( "ESOP (%d -> %d)\n", Vec_IntSize(vCover), vIsop.nSize );
                    Kit_TruthIsopPrintCover( &vIsop, If_CutLeaveNum(pCut), 0 );
                }
                printf( "\n" );
            }
        }
        return Delay;
    }
}